

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O1

char * AGSSockAPI::AGSFormatError(int errnum)

{
  code *UNRECOVERED_JUMPTABLE;
  long *plVar1;
  char *pcVar2;
  undefined8 extraout_RDX;
  
  plVar1 = engine;
  pcVar2 = strerror(errnum);
  UNRECOVERED_JUMPTABLE = *(code **)(*plVar1 + 0x248);
  pcVar2 = (char *)(*UNRECOVERED_JUMPTABLE)(plVar1,pcVar2,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return pcVar2;
}

Assistant:

const char *AGSFormatError(int errnum)
{
#ifdef _WIN32
	LPSTR msg = nullptr;
	FormatMessage(FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM,
	              0, errnum, 0, (LPSTR)&msg, 0, 0);
	const char *str = AGS_STRING(msg);
	LocalFree(msg);
	return str;
#else
	return AGS_STRING(strerror(errnum));
#endif
}